

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastpackwithoutmask11_16(uint32_t *in,uint32_t *out)

{
  undefined1 auVar1 [16];
  long unaff_RBX;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  
  vpmovsxbd_avx(ZEXT416(0x2c201408));
  auVar2 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + (ulong)(in[3] * 2)));
  auVar3 = vpinsrd_avx(ZEXT416(in[6]),in[9],1);
  auVar1 = vpshufd_avx(auVar2,0xe9);
  auVar3 = vpsllvd_avx2(auVar3,_DAT_00192eb0);
  auVar1 = vpsrlvd_avx2(auVar1,_DAT_0019dbe0);
  auVar1 = vpor_avx(auVar3,auVar1);
  vpmovsxbd_avx(ZEXT416(0x281c1004));
  auVar3 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + unaff_RBX));
  auVar4 = vpsllvd_avx2(auVar3,_DAT_0019dbf0);
  auVar3 = vpinsrd_avx(ZEXT416(*in),auVar2._0_4_ >> 10 | in[3] * 2,1);
  auVar3 = vpunpcklqdq_avx(auVar3,auVar1);
  auVar1 = vpsllvd_avx2(auVar2,_DAT_0019dc00);
  auVar4 = vpternlogd_avx512vl(auVar1,auVar4,auVar3,0xfe);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(in + 0xe);
  auVar1 = vpsllvd_avx2(auVar3,_DAT_0019dc10);
  auVar3 = vpinsrd_avx(ZEXT416(in[0xd] << 0xf | in[0xc] << 4 | auVar2._12_4_ >> 7),
                       (uint)(*(ulong *)(in + 0xe) >> 6) & 0x3ffffff,1);
  *(undefined1 (*) [16])out = auVar4;
  auVar3 = vpor_avx(auVar1,auVar3);
  *(long *)(out + 4) = auVar3._0_8_;
  return out + 6;
}

Assistant:

uint32_t *__fastpackwithoutmask11_16(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 11;
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  *out = ((*in)) >> (11 - 1);
  ++in;
  *out |= ((*in)) << 1;
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 23;
  ++out;
  *out = ((*in)) >> (11 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 13;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (11 - 3);
  ++in;
  *out |= ((*in)) << 3;
  ++in;
  *out |= ((*in)) << 14;
  ++in;
  *out |= ((*in)) << 25;
  ++out;
  *out = ((*in)) >> (11 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 15;
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (11 - 5);
  ++in;
  *out |= ((*in)) << 5;
  ++in;

  return out + 1;
}